

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.cpp
# Opt level: O2

sds duckdb_hll::sdstrim(sds s,char *cset)

{
  char *__src;
  size_t sVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  
  sVar1 = sdslen(s);
  pcVar3 = s + (sVar1 - 1);
  for (lVar4 = 0; __src = s + lVar4, __src <= pcVar3; lVar4 = lVar4 + 1) {
    pcVar2 = strchr(cset,(int)*__src);
    if (pcVar2 == (char *)0x0) break;
  }
  sVar1 = sVar1 - lVar4;
  for (; __src < pcVar3; pcVar3 = pcVar3 + -1) {
    pcVar2 = strchr(cset,(int)*pcVar3);
    if (pcVar2 == (char *)0x0) break;
    sVar1 = sVar1 - 1;
  }
  if (pcVar3 < __src) {
    sVar1 = 0;
  }
  if (lVar4 != 0) {
    memmove(s,__src,sVar1);
  }
  s[sVar1] = '\0';
  sdssetlen(s,sVar1);
  return s;
}

Assistant:

sds sdstrim(sds s, const char *cset) {
    char *start, *end, *sp, *ep;
    size_t len;

    sp = start = s;
    ep = end = s+sdslen(s)-1;
    while(sp <= end && strchr(cset, *sp)) sp++;
    while(ep > sp && strchr(cset, *ep)) ep--;
    len = (sp > ep) ? 0 : ((ep-sp)+1);
    if (s != sp) memmove(s, sp, len);
    s[len] = '\0';
    sdssetlen(s,len);
    return s;
}